

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_key_usage_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::ExtendedKeyUsageTest_ExtraData_Test::TestBody
          (ExtendedKeyUsageTest_ExtraData_Test *this)

{
  bool bVar1;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *in_RCX;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  Input extension_value;
  AssertionResult gtest_ar_;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> ekus;
  uint8_t extra_data [25];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  AssertHelper local_90;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  void *local_78;
  undefined8 uStack_70;
  long local_68;
  string local_58;
  undefined8 local_38;
  undefined1 uStack_30;
  undefined7 uStack_2f;
  undefined1 uStack_28;
  undefined8 uStack_27;
  
  uStack_28 = 1;
  uStack_27 = 0x101020203070505;
  local_38 = 0x501062b08061430;
  uStack_30 = 5;
  uStack_2f = 0x62b0806010307;
  local_78 = (void *)0x0;
  uStack_70 = 0;
  local_68 = 0;
  extension_value.data_.size_ = (size_t)&local_78;
  extension_value.data_.data_ = (uchar *)0x19;
  bVar1 = ParseEKUExtension((bssl *)&local_38,extension_value,in_RCX);
  local_88[0] = (internal)!bVar1;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_88,
               (AssertionResult *)"ParseEKUExtension(der::Input(extra_data), &ekus)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/extended_key_usage_unittest.cc"
               ,0x7a,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  return;
}

Assistant:

TEST(ExtendedKeyUsageTest, ExtraData) {
  // clang-format off
  const uint8_t extra_data[] = {
      0x30, 0x14,  // SEQUENCE (20 bytes)
      0x06, 0x08,  // OBJECT IDENTIFIER (8 bytes)
      0x2B, 0x06, 0x01, 0x05, 0x05, 0x07, 0x03, 0x01,  // 1.3.6.1.5.5.7.3.1
      0x06, 0x08,  // OBJECT IDENTIFIER (8 bytes)
      0x2B, 0x06, 0x01, 0x05, 0x05, 0x07, 0x03, 0x02,  // 1.3.6.1.5.5.7.3.2
      // end of SEQUENCE
      0x02, 0x01,  // INTEGER (1 byte)
      0x01  // 1
  };
  // clang-format on

  std::vector<der::Input> ekus;
  EXPECT_FALSE(ParseEKUExtension(der::Input(extra_data), &ekus));
}